

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O0

void __thiscall Monitor::start(Monitor *this)

{
  native_handle_type __target_thread;
  thread *in_RDI;
  Monitor **unaff_retaddr;
  type *in_stack_00000008;
  thread *in_stack_00000010;
  thread *in_stack_ffffffffffffffc8;
  
  std::thread::thread<void(Monitor::*)(),Monitor*,void>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::thread::operator=(in_RDI,in_stack_ffffffffffffffc8);
  std::thread::~thread((thread *)0x196fe1);
  __target_thread = std::thread::native_handle(in_RDI + 0x15);
  pthread_setname_np(__target_thread,"monitor");
  return;
}

Assistant:

void Monitor::start() {
  thread_ = std::thread(&Monitor::loop, this);
#ifdef __APPLE__
  pthread_setname_np("monitor");
#else
  pthread_setname_np(thread_.native_handle(), "monitor");
#endif
}